

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

int __thiscall
QMap<int,_QPointer<QAbstractItemDelegate>_>::remove
          (QMap<int,_QPointer<QAbstractItemDelegate>_> *this,char *__filename)

{
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar1;
  int iVar2;
  size_type sVar3;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var4;
  size_type sVar5;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    iVar2 = 0;
  }
  else {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value == (__atomic_base<int>)0x1) {
      sVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_QPointer<QAbstractItemDelegate>_>,_std::_Select1st<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
              ::erase(&(pQVar1->m)._M_t,(key_type *)__filename);
      return (int)sVar3;
    }
    this_00 = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
               *)operator_new(0x38);
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    (this_00->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_00->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var4 = &(this_00->m)._M_t._M_impl.super__Rb_tree_header;
    (this_00->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
    (this_00->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
    (this_00->m)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sVar5 = QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
            ::copyIfNotEquivalentTo(this_00,&pQVar1->m,(Key *)__filename);
    iVar2 = (int)sVar5;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_>
    ::reset(&this->d,this_00);
  }
  return iVar2;
}

Assistant:

constexpr P get() const noexcept { return ptr; }